

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_clusters,
          vector<crnlib::vector<unsigned_int>_> *clusters)

{
  void *pvVar1;
  vq_node *pvVar2;
  vector<crnlib::vector<unsigned_int>_> *pvVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_int> *pvVar8;
  uint uVar9;
  vector<unsigned_int> local_58;
  vector<crnlib::vector<unsigned_int>_> *local_40;
  clusterizer<crnlib::vec<2U,_float>_> *local_38;
  
  uVar4 = clusters->m_size;
  local_38 = this;
  if ((ulong)uVar4 != 0) {
    pvVar8 = clusters->m_p;
    lVar5 = 0;
    do {
      pvVar1 = *(void **)((long)&pvVar8->m_p + lVar5);
      if (pvVar1 != (void *)0x0) {
        crnlib_free(pvVar1);
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar5);
    clusters->m_size = 0;
  }
  vector<crnlib::vector<unsigned_int>_>::reserve(clusters,max_clusters);
  local_58.m_p = (uint *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_58,0x200);
  uVar6 = 0;
  local_40 = clusters;
  do {
    pvVar3 = local_40;
    pvVar2 = (local_38->m_nodes).m_p;
    uVar4 = pvVar2[uVar6].m_left;
    if (((int)uVar4 < 0) || ((int)max_clusters < pvVar2[uVar6].m_codebook_index + 2)) {
      uVar4 = clusters->m_size;
      uVar7 = (ulong)uVar4;
      uVar9 = uVar4 + 1;
      if (uVar9 == 0) {
        pvVar8 = clusters->m_p;
        lVar5 = 0;
        do {
          pvVar1 = *(void **)((long)&pvVar8->m_p + lVar5);
          if (pvVar1 != (void *)0x0) {
            crnlib_free(pvVar1);
          }
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0xffffffff0);
      }
      else {
        if (clusters->m_capacity < uVar9) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_40,uVar9,true,0x10,(object_mover)0x0,false);
          uVar4 = pvVar3->m_size;
          if (uVar4 == uVar9) goto LAB_00143d98;
        }
        memset(local_40->m_p + uVar4,0,(ulong)(uVar9 - uVar4) << 4);
      }
LAB_00143d98:
      clusters = local_40;
      local_40->m_size = uVar9;
      pvVar8 = local_40->m_p + uVar7;
      if (pvVar8 != &pvVar2[uVar6].m_vectors) {
        uVar4 = pvVar2[uVar6].m_vectors.m_size;
        if (pvVar8->m_capacity < uVar4) {
          if (pvVar8->m_p != (uint *)0x0) {
            crnlib_free(pvVar8->m_p);
            pvVar8->m_p = (uint *)0x0;
            pvVar8->m_size = 0;
            pvVar8->m_capacity = 0;
            uVar4 = pvVar2[uVar6].m_vectors.m_size;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar8,uVar4,false,4,(object_mover)0x0,false);
        }
        else if (pvVar8->m_size != 0) {
          pvVar8->m_size = 0;
        }
        memcpy(pvVar8->m_p,pvVar2[uVar6].m_vectors.m_p,(ulong)pvVar2[uVar6].m_vectors.m_size << 2);
        pvVar8->m_size = pvVar2[uVar6].m_vectors.m_size;
      }
      if (local_58.m_size == 0) {
        if (local_58.m_p != (uint *)0x0) {
          crnlib_free(local_58.m_p);
        }
        return;
      }
      local_58.m_size = local_58.m_size - 1;
      uVar4 = local_58.m_p[local_58.m_size];
    }
    else {
      uVar9 = pvVar2[uVar6].m_right;
      if (local_58.m_capacity <= local_58.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_58,local_58.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_58.m_p[local_58.m_size] = uVar9;
      local_58.m_size = local_58.m_size + 1;
    }
    uVar6 = (ulong)uVar4;
  } while( true );
}

Assistant:

void retrieve_clusters(uint max_clusters, crnlib::vector<crnlib::vector<uint>>& clusters) const
        {
            clusters.resize(0);
            clusters.reserve(max_clusters);

            crnlib::vector<uint> stack;
            stack.reserve(512);

            uint cur_node_index = 0;

            for (;;)
            {
                const vq_node& cur_node = m_nodes[cur_node_index];

                if ((cur_node.is_leaf()) || ((cur_node.m_codebook_index + 2) > (int)max_clusters))
                {
                    clusters.resize(clusters.size() + 1);
                    clusters.back() = cur_node.m_vectors;

                    if (stack.empty())
                    {
                        break;
                    }
                    cur_node_index = stack.back();
                    stack.pop_back();
                    continue;
                }

                cur_node_index = cur_node.m_left;
                stack.push_back(cur_node.m_right);
            }
        }